

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::serialize_multipart_formdata
                   (string *__return_storage_ptr__,MultipartFormDataItems *items,string *boundary,
                   bool finish)

{
  pointer pMVar1;
  MultipartFormData *item;
  pointer item_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar1 = (items->
           super__Vector_base<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (item_00 = (items->
                 super__Vector_base<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>
                 )._M_impl.super__Vector_impl_data._M_start; item_00 != pMVar1;
      item_00 = item_00 + 1) {
    serialize_multipart_formdata_item_begin<httplib::MultipartFormData>(&local_70,item_00,boundary);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    serialize_multipart_formdata_item_end_abi_cxx11_();
    std::operator+(&local_70,&item_00->content,&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (finish) {
    serialize_multipart_formdata_finish(&local_70,boundary);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
serialize_multipart_formdata(const MultipartFormDataItems &items,
                             const std::string &boundary, bool finish = true) {
  std::string body;

  for (const auto &item : items) {
    body += serialize_multipart_formdata_item_begin(item, boundary);
    body += item.content + serialize_multipart_formdata_item_end();
  }

  if (finish) body += serialize_multipart_formdata_finish(boundary);

  return body;
}